

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void RenderArrowsForVerticalBar
               (ImDrawList *draw_list,ImVec2 pos,ImVec2 half_sz,float bar_w,float alpha)

{
  float fVar1;
  undefined8 in_XMM0_Qa;
  ImVec2 in_XMM1_Qa;
  float in_XMM2_Da;
  float in_XMM3_Da;
  ImU32 alpha8;
  ImVec2 local_60;
  float in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  ImVec2 in_stack_ffffffffffffffb0;
  ImVec2 in_stack_ffffffffffffffb8;
  ImVec2 half_sz_00;
  ImVec2 in_stack_ffffffffffffffc0;
  ImVec2 local_34;
  ImVec2 local_2c;
  int local_24;
  float local_1c;
  ImVec2 local_10;
  undefined8 local_8;
  
  local_1c = in_XMM2_Da;
  local_10 = in_XMM1_Qa;
  local_8 = in_XMM0_Qa;
  fVar1 = ImSaturate(in_XMM3_Da);
  local_24 = (int)(fVar1 * 255.0 + 0.5);
  ImVec2::ImVec2(&local_2c,(float)local_8 + local_10.x + 1.0,local_8._4_4_);
  ImVec2::ImVec2(&local_34,local_10.x + 2.0,local_10.y + 1.0);
  ImGui::RenderArrowPointingAt
            ((ImDrawList *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8,(ImGuiDir)in_stack_ffffffffffffffac,
             (ImU32)in_stack_ffffffffffffffa8);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffc4,(float)local_8 + local_10.x,local_8._4_4_);
  half_sz_00 = local_10;
  ImGui::RenderArrowPointingAt
            ((ImDrawList *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffc0,local_10,
             (ImGuiDir)in_stack_ffffffffffffffac,(ImU32)in_stack_ffffffffffffffa8);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffb0,(((float)local_8 + local_1c) - local_10.x) - 1.0
                 ,local_8._4_4_);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa8,local_10.x + 2.0,local_10.y + 1.0);
  ImGui::RenderArrowPointingAt
            ((ImDrawList *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffc0,half_sz_00,
             (ImGuiDir)in_stack_ffffffffffffffac,(ImU32)in_stack_ffffffffffffffa8);
  ImVec2::ImVec2(&local_60,((float)local_8 + local_1c) - local_10.x,local_8._4_4_);
  ImGui::RenderArrowPointingAt
            ((ImDrawList *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffc0,half_sz_00,
             (ImGuiDir)in_stack_ffffffffffffffac,(ImU32)in_stack_ffffffffffffffa8);
  return;
}

Assistant:

static void RenderArrowsForVerticalBar(ImDrawList* draw_list, ImVec2 pos, ImVec2 half_sz, float bar_w, float alpha)
{
    ImU32 alpha8 = IM_F32_TO_INT8_SAT(alpha);
    ImGui::RenderArrowPointingAt(draw_list, ImVec2(pos.x + half_sz.x + 1,         pos.y), ImVec2(half_sz.x + 2, half_sz.y + 1), ImGuiDir_Right, IM_COL32(0,0,0,alpha8));
    ImGui::RenderArrowPointingAt(draw_list, ImVec2(pos.x + half_sz.x,             pos.y), half_sz,                              ImGuiDir_Right, IM_COL32(255,255,255,alpha8));
    ImGui::RenderArrowPointingAt(draw_list, ImVec2(pos.x + bar_w - half_sz.x - 1, pos.y), ImVec2(half_sz.x + 2, half_sz.y + 1), ImGuiDir_Left,  IM_COL32(0,0,0,alpha8));
    ImGui::RenderArrowPointingAt(draw_list, ImVec2(pos.x + bar_w - half_sz.x,     pos.y), half_sz,                              ImGuiDir_Left,  IM_COL32(255,255,255,alpha8));
}